

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

Endpoint * __thiscall
helics::MessageFederateManager::getDataSink(MessageFederateManager *this,string_view name)

{
  bool bVar1;
  string *__lhs;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> ept;
  handle sharedEpt;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> local_60;
  handle local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_48,&this->mLocalEndpoints);
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_60,local_48.data,name);
  gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
            (&local_30,&(local_48.data)->dataStorage);
  bVar1 = gmlc::containers::BlockIterator<helics::Endpoint,32,helics::Endpoint**>::operator==
                    ((BlockIterator<helics::Endpoint,32,helics::Endpoint**> *)&local_60,&local_30);
  if (!bVar1) {
    __lhs = Interface::getExtractionType_abi_cxx11_(&(local_60.ptr)->super_Interface);
    bVar1 = std::operator==(__lhs,"sink");
    if (bVar1) goto LAB_001b2f2d;
  }
  local_60.ptr = (Endpoint *)invalidEptNC;
LAB_001b2f2d:
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
  return local_60.ptr;
}

Assistant:

Endpoint& MessageFederateManager::getDataSink(std::string_view name)
{
    auto sharedEpt = mLocalEndpoints.lock();
    auto ept = sharedEpt->find(name);
    if (ept == sharedEpt.end()) {
        return invalidEptNC;
    }
    if (ept->getType() != "sink") {
        return invalidEptNC;
    }
    return *ept;
}